

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_mristep.c
# Opt level: O3

int mriStep_ComputeInnerForcing(ARKodeMRIStepMem step_mem,int stage,realtype cdiff)

{
  int iVar1;
  realtype *c;
  N_Vector *X;
  int *piVar2;
  MRIStepCoupling pMVar3;
  long lVar4;
  int iVar5;
  ulong uVar6;
  long lVar7;
  int iVar8;
  double dVar9;
  
  c = step_mem->cvals;
  X = step_mem->Xvecs;
  if (0 < stage) {
    iVar5 = step_mem->explicit_rhs;
    iVar1 = step_mem->implicit_rhs;
    uVar6 = 0;
    iVar8 = 0;
    do {
      if ((iVar5 != 0) && (-1 < (long)step_mem->stage_map[uVar6])) {
        X[iVar8] = step_mem->Fse[step_mem->stage_map[uVar6]];
        iVar8 = iVar8 + 1;
      }
      if ((iVar1 != 0) && (-1 < (long)step_mem->stage_map[uVar6])) {
        X[iVar8] = step_mem->Fsi[step_mem->stage_map[uVar6]];
        iVar8 = iVar8 + 1;
      }
      uVar6 = uVar6 + 1;
    } while ((uint)stage != uVar6);
  }
  lVar4 = (long)step_mem->MRIC->nmat;
  if (0 < lVar4) {
    dVar9 = 1.0 / cdiff;
    lVar7 = 0;
    do {
      iVar5 = 0;
      if (0 < stage) {
        piVar2 = step_mem->stage_map;
        uVar6 = 0;
        iVar5 = 0;
        do {
          if (-1 < piVar2[uVar6]) {
            if (step_mem->explicit_rhs == 0) {
              c[iVar5] = step_mem->MRIC->G[lVar7][stage][uVar6] * dVar9;
            }
            else {
              iVar1 = step_mem->implicit_rhs;
              pMVar3 = step_mem->MRIC;
              c[iVar5] = pMVar3->W[lVar7][stage][uVar6] * dVar9;
              if (iVar1 != 0) {
                c[(long)iVar5 + 1] = pMVar3->G[lVar7][stage][uVar6] * dVar9;
                iVar5 = iVar5 + 2;
                goto LAB_003e8677;
              }
            }
            iVar5 = iVar5 + 1;
          }
LAB_003e8677:
          uVar6 = uVar6 + 1;
        } while ((uint)stage != uVar6);
      }
      iVar5 = N_VLinearCombination(iVar5,c,X,step_mem->stepper->forcing[lVar7]);
      if (iVar5 != 0) {
        return -0x1c;
      }
      lVar7 = lVar7 + 1;
    } while (lVar7 != lVar4);
  }
  return 0;
}

Assistant:

int mriStep_ComputeInnerForcing(ARKodeMRIStepMem step_mem,
                                int stage, realtype cdiff)
{
  realtype  rcdiff;
  int       j, k, nmat, nstore, retval;
  realtype* cvals;
  N_Vector* Xvecs;

  /* local shortcuts for fused vector operations */
  cvals = step_mem->cvals;
  Xvecs = step_mem->Xvecs;

  /* compute inner forcing vectors (assumes cdiff != 0) */
  nstore = 0;
  for (j = 0; j < stage; j++) {
    if (step_mem->explicit_rhs && step_mem->stage_map[j] > -1) {
      Xvecs[nstore] = step_mem->Fse[step_mem->stage_map[j]];
      nstore += 1;
    }
    if (step_mem->implicit_rhs && step_mem->stage_map[j] > -1) {
      Xvecs[nstore] = step_mem->Fsi[step_mem->stage_map[j]];
      nstore += 1;
    }
  }

  nmat   = step_mem->MRIC->nmat;
  rcdiff = ONE / cdiff;

  for (k = 0; k < nmat; k++) {
    nstore = 0;
    for (j = 0; j < stage; j++) {
      if (step_mem->stage_map[j] > -1) {
        if (step_mem->explicit_rhs && step_mem->implicit_rhs) {
          /* ImEx */
          cvals[nstore] = rcdiff * step_mem->MRIC->W[k][stage][j];
          nstore += 1;
          cvals[nstore] = rcdiff * step_mem->MRIC->G[k][stage][j];
          nstore += 1;
        } else if (step_mem->explicit_rhs) {
          /* explicit only */
          cvals[nstore] = rcdiff * step_mem->MRIC->W[k][stage][j];
          nstore += 1;
        } else {
          /* implicit only */
          cvals[nstore] = rcdiff * step_mem->MRIC->G[k][stage][j];
          nstore += 1;
        }
      }
    }

    retval = N_VLinearCombination(nstore, cvals, Xvecs,
                                  step_mem->stepper->forcing[k]);
    if (retval != 0) return(ARK_VECTOROP_ERR);
  }

#ifdef SUNDIALS_DEBUG_PRINTVEC
  for (k = 0; k < nmat; k++) {
    printf("    MRIStep forcing[%i]:\n", k);
    N_VPrint(step_mem->stepper->forcing[k]);
  }
#endif

  return(ARK_SUCCESS);
}